

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimAngular::Dim2dPoint(ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  ON_2dPoint *pOVar1;
  uint uVar2;
  ON_AngularDimension2Extra *pOVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dd_00;
  double dVar8;
  double dVar9;
  ON_2dPoint OVar10;
  ON_2dVector v2;
  ON_2dPoint local_68;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  ON_2dPoint local_38;
  ON_2dVector local_28;
  
  if ((point_index < 0) ||
     ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count < 4)
     ) {
switchD_004a7bdf_default:
    dVar8 = -1.23432101234321e+308;
    dVar9 = -1.23432101234321e+308;
    goto LAB_004a7c06;
  }
  uVar2 = 0x2713;
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
    uVar2 = 0;
  }
  if (point_index != 10000) {
    uVar2 = point_index;
  }
  if (uVar2 < 4) {
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a +
             uVar2;
    uVar4 = *(undefined4 *)&pOVar1->x;
    uVar5 = *(undefined4 *)((long)&pOVar1->x + 4);
    uVar6 = *(undefined4 *)&pOVar1->y;
    uVar7 = *(undefined4 *)((long)&pOVar1->y + 4);
LAB_004a7bc0:
    dVar9 = (double)CONCAT44(uVar7,uVar6);
    dVar8 = (double)CONCAT44(uVar5,uVar4);
    goto LAB_004a7c06;
  }
  switch(uVar2) {
  case 0x2711:
    dVar8 = this->m_radius;
    dVar9 = 0.0;
    goto LAB_004a7c06;
  case 0x2712:
    local_58 = this->m_radius;
    dStack_50 = 0.0;
    dVar8 = cos(this->m_angle);
    local_48._8_4_ = extraout_XMM0_Dc_00;
    local_48._0_8_ = dVar8;
    local_48._12_4_ = extraout_XMM0_Dd_00;
    dVar8 = this->m_angle;
    dStack_50 = this->m_radius;
    break;
  case 0x2713:
    local_58 = this->m_radius;
    dStack_50 = 0.0;
    dVar8 = cos(this->m_angle * 0.5);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar8;
    local_48._12_4_ = extraout_XMM0_Dd;
    dVar8 = this->m_angle * 0.5;
    dStack_50 = this->m_radius;
    break;
  case 0x2714:
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    goto LAB_004a7bc0;
  case 0x2715:
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar8 = pOVar1[1].x;
    dVar9 = pOVar1[1].y;
    local_68.x._0_4_ = SUB84(dVar8,0);
    local_68.x._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
    local_68.y._0_4_ = SUB84(dVar9,0);
    local_68.y._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
    pOVar3 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
    dVar9 = (double)CONCAT44(local_68.y._4_4_,local_68.y._0_4_);
    dVar8 = (double)CONCAT44(local_68.x._4_4_,local_68.x._0_4_);
    if (pOVar3 == (ON_AngularDimension2Extra *)0x0) goto LAB_004a7c06;
    local_58 = pOVar3->m_dimpoint_offset[0];
    goto LAB_004a7d22;
  case 0x2716:
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar8 = pOVar1[2].x;
    dVar9 = pOVar1[2].y;
    local_68.x._0_4_ = SUB84(dVar8,0);
    local_68.x._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
    local_68.y._0_4_ = SUB84(dVar9,0);
    local_68.y._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
    pOVar3 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
    dVar9 = (double)CONCAT44(local_68.y._4_4_,local_68.y._0_4_);
    dVar8 = (double)CONCAT44(local_68.x._4_4_,local_68.x._0_4_);
    if (pOVar3 == (ON_AngularDimension2Extra *)0x0) goto LAB_004a7c06;
    local_58 = pOVar3->m_dimpoint_offset[1];
LAB_004a7d22:
    dVar9 = (double)CONCAT44(local_68.y._4_4_,local_68.y._0_4_);
    dVar8 = (double)CONCAT44(local_68.x._4_4_,local_68.x._0_4_);
    if (0.0 <= local_58) {
      ON_2dVector::ON_2dVector(&local_28,&local_68);
      ON_2dVector::Unitize(&local_28);
      ON_2dPoint::ON_2dPoint(&local_38,&local_28);
      OVar10 = ON_2dPoint::operator*(&local_38,local_58);
      dVar9 = OVar10.y;
      dVar8 = OVar10.x;
    }
    goto LAB_004a7c06;
  default:
    goto switchD_004a7bdf_default;
  }
  dVar9 = sin(dVar8);
  dVar8 = (double)local_48._0_8_ * local_58;
  dVar9 = dVar9 * dStack_50;
LAB_004a7c06:
  local_68.y._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
  local_68.y._0_4_ = SUB84(dVar9,0);
  OVar10.y._0_4_ = local_68.y._0_4_;
  OVar10.x = dVar8;
  OVar10.y._4_4_ = local_68.y._4_4_;
  return OVar10;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimAngular::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext 
                  ? userpositionedtext_pt_index
                  : arcmid_pt;
    }
    
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }
    else
    {
      switch(point_index)
      {
      case arcstart_pt:
        p2.x = m_radius;
        p2.y = 0.0;
        break;
      case arcend_pt:
        p2.x = m_radius*cos(m_angle);
        p2.y = m_radius*sin(m_angle);
        break;
      case arccenter_pt:
        p2.x = 0.0;
        p2.y = 0.0;
        break;
      case arcmid_pt:
        p2.x = m_radius*cos(0.5*m_angle);
        p2.y = m_radius*sin(0.5*m_angle);
        break;
      case extension0_pt:
        {
          p2 = m_points[start_pt_index];
          double dp0 = DimpointOffset(0);
          if(dp0 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp0;
          }
        }
        break;
      case extension1_pt:
        {
          p2 = m_points[end_pt_index];
          double dp1 = DimpointOffset(1);
          if(dp1 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp1;
          }
        }
        break;
      default:
        p2.x = p2.y = ON_UNSET_VALUE;
        break;
      }
    }
  }
  return p2;
}